

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O1

string * gmlc::utilities::randomString_abi_cxx11_(size_type length)

{
  long lVar1;
  result_type rVar2;
  size_type in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool bVar3;
  size_type local_13b8;
  random_device local_13b0;
  
  lVar1 = __tls_get_addr(&PTR_0057ccf0);
  if (*(char *)(lVar1 + 0x2790) == '\0') {
    std::random_device::random_device(&local_13b0);
    std::random_device::_M_getval();
    randomString_abi_cxx11_();
    *(undefined8 *)(lVar1 + 0x2788) = 0x270;
    std::random_device::_M_fini();
    *(undefined1 *)(lVar1 + 0x2790) = 1;
  }
  if (*(char *)(lVar1 + 0x27a8) == '\0') {
    randomString_abi_cxx11_();
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_RDI,in_RSI);
  local_13b8 = in_RSI;
  while (bVar3 = local_13b8 != 0, local_13b8 = local_13b8 - 1, bVar3) {
    rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)(lVar1 + 0x2798),
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + 0x1408),(param_type *)(lVar1 + 0x2798));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar2]);
  }
  return in_RDI;
}

Assistant:

std::string randomString(std::string::size_type length)
{
    static constexpr auto chars =
        "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

    thread_local static std::mt19937 rng{
        std::random_device{}() +
        static_cast<uint32_t>(
            reinterpret_cast<uint64_t>(&length) &  // NOLINT
            0xFFFFFFFFU)};
    thread_local static std::uniform_int_distribution<std::string::size_type>
        pick(0, 61);
    std::string randomString;

    randomString.reserve(length);

    while (length-- != 0U) {
        randomString.push_back(chars[pick(rng)]);
    }

    return randomString;
}